

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Morton.cpp
# Opt level: O0

MortonCode64 __thiscall Resorting::MortonCode64::operator-(MortonCode64 *this,MortonCode64 rhs)

{
  MortonCode64 MVar1;
  MortonCode64 *this_local;
  MortonCode64 rhs_local;
  
  this_local = (MortonCode64 *)rhs.data;
  MVar1 = Negate((MortonCode64 *)&this_local);
  MVar1 = operator+(this,MVar1);
  return (MortonCode64)MVar1.data;
}

Assistant:

MortonCode64 MortonCode64::operator-(const MortonCode64 rhs) const
{
    return *this + rhs.Negate();
}